

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSoftBodyTriangleCallback::processTriangle
          (btSoftBodyTriangleCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btVector3 *v1;
  btVector3 *v1_00;
  btDispatcher *pbVar1;
  btIDebugDraw *pbVar2;
  btCollisionShape *pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  btVector3 bVar8;
  uint uVar9;
  int iVar10;
  btTriIndex *pbVar11;
  undefined4 extraout_var;
  btConvexHullShape *this_00;
  undefined4 extraout_var_00;
  btTransform *this_01;
  float fVar13;
  btHashKey<btTriIndex> triKey;
  btTriIndex triIndex;
  btCollisionObjectWrapper triBody;
  btCollisionObjectWrapper triBody_1;
  btCollisionObjectWrapper softBody;
  undefined8 uStack_80;
  btVector3 local_40;
  long *plVar12;
  
  pbVar1 = this->m_dispatcher;
  if ((this->m_dispatchInfoPtr != (btDispatcherInfo *)0x0) &&
     (pbVar2 = this->m_dispatchInfoPtr->m_debugDraw, pbVar2 != (btIDebugDraw *)0x0)) {
    uVar9 = (*pbVar2->_vptr_btIDebugDraw[0xe])();
    if ((uVar9 & 1) != 0) {
      softBody._0_16_ = ZEXT816(0x3f8000003f800000);
      this_01 = &this->m_triBody->m_worldTransform;
      pbVar2 = this->m_dispatchInfoPtr->m_debugDraw;
      triBody._0_16_ = btTransform::operator()(this_01,triangle);
      triBody_1._0_16_ = btTransform::operator()(this_01,triangle + 1);
      (*pbVar2->_vptr_btIDebugDraw[4])(pbVar2,&triBody,&triBody_1,&softBody);
      pbVar2 = this->m_dispatchInfoPtr->m_debugDraw;
      triBody._0_16_ = btTransform::operator()(this_01,triangle + 1);
      triBody_1._0_16_ = btTransform::operator()(this_01,triangle + 2);
      (*pbVar2->_vptr_btIDebugDraw[4])(pbVar2,&triBody,&triBody_1,&softBody);
      pbVar2 = this->m_dispatchInfoPtr->m_debugDraw;
      triBody._0_16_ = btTransform::operator()(this_01,triangle + 2);
      triBody_1._0_16_ = btTransform::operator()(this_01,triangle);
      (*pbVar2->_vptr_btIDebugDraw[4])(pbVar2,&triBody,&triBody_1,&softBody);
    }
  }
  triKey.m_uid = partId << 0x15 | triangleIndex;
  triIndex.m_childShape = (btCollisionShape *)0x0;
  triIndex.m_PartIdTriangleIndex = triKey.m_uid;
  pbVar11 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::find(&this->m_shapeCache,&triKey);
  if (pbVar11 == (btTriIndex *)0x0) {
    v1 = triangle + 1;
    softBody._0_16_ = operator-(v1,triangle);
    v1_00 = triangle + 2;
    triBody._0_16_ = operator-(v1_00,triangle);
    local_40 = btVector3::cross((btVector3 *)&softBody,(btVector3 *)&triBody);
    btVector3::normalize(&local_40);
    bVar8.m_floats = local_40.m_floats;
    fVar13 = local_40.m_floats[0];
    local_40.m_floats[1] = local_40.m_floats[1] * 0.06;
    local_40.m_floats[0] = fVar13 * 0.06;
    local_40.m_floats[2] = bVar8.m_floats[2];
    local_40.m_floats[3] = bVar8.m_floats[3];
    local_40.m_floats[2] = local_40.m_floats[2] * 0.06;
    softBody._0_16_ = operator+(triangle,&local_40);
    softBody._16_16_ = operator+(v1,&local_40);
    join_0x00001240_0x00001200_ = operator+(v1_00,&local_40);
    operator-(triangle,&local_40);
    operator-(v1,&local_40);
    operator-(v1_00,&local_40);
    this_00 = (btConvexHullShape *)btConvexHullShape::operator_new(0x98);
    btConvexHullShape::btConvexHullShape(this_00,(btScalar *)&softBody,6,0x10);
    triBody_1.m_collisionObject = this->m_triBody;
    (this_00->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
    super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_userPointer =
         (triBody_1.m_collisionObject)->m_collisionShape->m_userPointer;
    triBody.m_collisionObject = &this->m_softBody->super_btCollisionObject;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (((btSoftBody *)triBody.m_collisionObject)->super_btCollisionObject).
                   m_collisionShape;
    triBody._0_16_ = auVar6 << 0x40;
    triBody.m_worldTransform =
         &(((btSoftBody *)triBody.m_collisionObject)->super_btCollisionObject).m_worldTransform;
    triBody.m_partId = -1;
    triBody.m_index = -1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this_00;
    triBody_1._0_16_ = auVar7 << 0x40;
    triBody_1.m_worldTransform = &(triBody_1.m_collisionObject)->m_worldTransform;
    triBody_1.m_partId = partId;
    triBody_1.m_index = triangleIndex;
    iVar10 = (*pbVar1->_vptr_btDispatcher[2])(pbVar1,&triBody,&triBody_1,0);
    plVar12 = (long *)CONCAT44(extraout_var_00,iVar10);
    (**(code **)(*plVar12 + 0x10))
              (plVar12,&triBody,&triBody_1,this->m_dispatchInfoPtr,this->m_resultOut);
    (**(code **)*plVar12)(plVar12);
    (*pbVar1->_vptr_btDispatcher[0xf])(pbVar1,plVar12);
    triIndex.m_childShape = (btCollisionShape *)this_00;
    btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert(&this->m_shapeCache,&triKey,&triIndex);
  }
  else {
    pbVar3 = pbVar11->m_childShape;
    triBody.m_collisionObject = this->m_triBody;
    pbVar3->m_userPointer = (triBody.m_collisionObject)->m_collisionShape->m_userPointer;
    softBody.m_collisionObject = &this->m_softBody->super_btCollisionObject;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (((btSoftBody *)softBody.m_collisionObject)->super_btCollisionObject).
                   m_collisionShape;
    softBody._0_16_ = auVar4 << 0x40;
    softBody.m_worldTransform =
         &(((btSoftBody *)softBody.m_collisionObject)->super_btCollisionObject).m_worldTransform;
    uStack_80 = softBody._32_8_;
    softBody.m_partId = -1;
    softBody.m_index = -1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pbVar3;
    triBody._0_16_ = auVar5 << 0x40;
    triBody.m_worldTransform = &(triBody.m_collisionObject)->m_worldTransform;
    triBody.m_index = triangleIndex;
    triBody.m_partId = partId;
    iVar10 = (*pbVar1->_vptr_btDispatcher[2])(pbVar1,&softBody,&triBody,0);
    plVar12 = (long *)CONCAT44(extraout_var,iVar10);
    (**(code **)(*plVar12 + 0x10))
              (plVar12,&softBody,&triBody,this->m_dispatchInfoPtr,this->m_resultOut);
    (**(code **)*plVar12)(plVar12);
    (*pbVar1->_vptr_btDispatcher[0xf])(pbVar1,plVar12);
  }
  return;
}

Assistant:

void btSoftBodyTriangleCallback::processTriangle(btVector3* triangle,int partId, int triangleIndex)
{
	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);
	
	btCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &btIDebugDraw::DBG_DrawWireframe))
	{
		btVector3 color(1,1,0);
		const btTransform& tr = m_triBody->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}

	btTriIndex	triIndex(partId,triangleIndex,0);
	btHashKey<btTriIndex> triKey(triIndex.getUid());


	btTriIndex* shapeIndex = m_shapeCache[triKey];
	if (shapeIndex)
	{
		btCollisionShape* tm = shapeIndex->m_childShape;
		btAssert(tm);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		//btCollisionObjectWrapper triBody(0,tm, ob, btTransform::getIdentity());//ob->getWorldTransform());//??
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
		
		return;
	}

	//aabb filter is already applied!	

	//btCollisionObject* colObj = static_cast<btCollisionObject*>(m_convexProxy->m_clientObject);

	//	if (m_softBody->getCollisionShape()->getShapeType()==
	{
		//		btVector3 other;
		btVector3 normal = (triangle[1]-triangle[0]).cross(triangle[2]-triangle[0]);
		normal.normalize();
		normal*= BT_SOFTBODY_TRIANGLE_EXTRUSION;
		//		other=(triangle[0]+triangle[1]+triangle[2])*0.333333f;
		//		other+=normal*22.f;
		btVector3	pts[6] = {triangle[0]+normal,
			triangle[1]+normal,
			triangle[2]+normal,
			triangle[0]-normal,
			triangle[1]-normal,
			triangle[2]-normal};

		btConvexHullShape* tm = new btConvexHullShape(&pts[0].getX(),6);


		//		btBU_Simplex1to4 tm(triangle[0],triangle[1],triangle[2],other);

		//btTriangleShape tm(triangle[0],triangle[1],triangle[2]);	
		//	tm.setMargin(m_collisionMarginTriangle);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		
		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);//btTransform::getIdentity());//??

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);

		triIndex.m_childShape = tm;
		m_shapeCache.insert(triKey,triIndex);

	}



}